

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_portable_deserialize_frozen(char *buf)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  char *res;
  ulong uVar4;
  roaring_bitmap_t *prVar5;
  int iVar6;
  char *res_2;
  uint8_t *puVar7;
  ulong uVar8;
  ushort *puVar9;
  ushort *puVar10;
  int iVar11;
  int iVar12;
  char *res_1;
  ulong uVar13;
  int32_t *piVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  long lVar21;
  uint *puVar22;
  
  uVar3 = *(uint *)buf;
  if (uVar3 == 0x303a) {
    uVar13 = (ulong)*(int *)(buf + 4);
    pcVar19 = buf + 8;
    pcVar20 = buf + uVar13 * 4 + 8;
    puVar9 = (ushort *)(pcVar20 + uVar13 * 4);
    pcVar18 = (char *)0x0;
  }
  else {
    if ((short)uVar3 != 0x303b) {
      return (roaring_bitmap_t *)0x0;
    }
    pcVar18 = buf + 4;
    uVar16 = uVar3 >> 0x10;
    pcVar19 = pcVar18 + (uVar16 + 8 >> 3);
    uVar4 = (ulong)(uVar16 * 4 + 4);
    pcVar20 = (char *)0x0;
    if (0x2ffff < uVar3) {
      pcVar20 = pcVar19 + uVar4;
    }
    uVar13 = (ulong)(uVar16 + 1);
    uVar8 = 0;
    if (0x2ffff < uVar3) {
      uVar8 = uVar4;
    }
    puVar9 = (ushort *)(pcVar19 + uVar4 + uVar8);
  }
  uVar4 = 0;
  iVar11 = (int)uVar13;
  uVar8 = 0;
  if (0 < iVar11) {
    uVar8 = uVar13 & 0xffffffff;
  }
  iVar6 = 0;
  iVar12 = 0;
  iVar15 = 0;
  for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    if (uVar3 == 0x303a) {
      if (*(ushort *)(pcVar19 + uVar4 * 4 + 2) < 0x1000) {
LAB_001089a0:
        iVar6 = iVar6 + 1;
      }
      else {
LAB_00108993:
        iVar15 = iVar15 + 1;
      }
    }
    else {
      uVar16 = 1 << ((byte)uVar4 & 7) & (uint)(byte)pcVar18[uVar4 >> 3 & 0x1fffffff];
      if ((uVar16 == 0) && (0xfff < *(ushort *)(pcVar19 + uVar4 * 4 + 2))) goto LAB_00108993;
      if (uVar16 == 0) goto LAB_001089a0;
      iVar12 = iVar12 + 1;
    }
  }
  lVar21 = (long)iVar11;
  prVar5 = (roaring_bitmap_t *)
           roaring_malloc(((long)iVar6 + (long)iVar12 + (long)iVar15) * 0x10 + lVar21 * 0xb + 0x28);
  if (prVar5 == (roaring_bitmap_t *)0x0) {
    return (roaring_bitmap_t *)0x0;
  }
  (prVar5->high_low_container).flags = '\x02';
  (prVar5->high_low_container).allocation_size = iVar11;
  (prVar5->high_low_container).size = iVar11;
  piVar14 = &prVar5[1].high_low_container.size + lVar21 * 2;
  (prVar5->high_low_container).containers = (void **)(prVar5 + 1);
  puVar7 = (uint8_t *)((long)piVar14 + lVar21 * 2);
  puVar22 = (uint *)(puVar7 + lVar21);
  (prVar5->high_low_container).keys = (uint16_t *)piVar14;
  (prVar5->high_low_container).typecodes = puVar7;
  uVar4 = 0;
  do {
    if (uVar8 == uVar4) {
      return prVar5;
    }
    uVar2 = *(ushort *)(pcVar19 + uVar4 * 4 + 2);
    uVar16 = (uint)((ulong)uVar2 + 1);
    puVar10 = puVar9;
    if (uVar3 == 0x303a) {
      *(undefined2 *)((long)piVar14 + uVar4 * 2) = *(undefined2 *)(pcVar19 + uVar4 * 4);
      if (uVar2 < 0x1000) {
LAB_00108ad6:
        puVar7[uVar4] = '\x02';
        *puVar22 = uVar16;
        puVar22[1] = uVar16;
        if (pcVar20 == (char *)0x0) {
          puVar10 = puVar9 + (ulong)uVar2 + 1;
          goto LAB_00108aef;
        }
      }
      else {
LAB_00108a93:
        puVar7[uVar4] = '\x01';
        *puVar22 = uVar16;
        if (pcVar20 == (char *)0x0) {
          puVar10 = puVar9 + 0x1000;
          goto LAB_00108aef;
        }
      }
      puVar9 = (ushort *)(buf + *(uint *)(pcVar20 + uVar4 * 4));
    }
    else {
      bVar1 = pcVar18[uVar4 >> 3 & 0x1fffffff];
      *(undefined2 *)((long)piVar14 + uVar4 * 2) = *(undefined2 *)(pcVar19 + uVar4 * 4);
      uVar17 = 1 << ((byte)uVar4 & 7) & (uint)bVar1;
      if ((uVar17 == 0) && (0xfff < uVar2)) goto LAB_00108a93;
      if (uVar17 == 0) goto LAB_00108ad6;
      puVar7[uVar4] = '\x03';
      puVar22[1] = uVar16;
      if (pcVar20 == (char *)0x0) {
        uVar2 = *puVar9;
        *puVar22 = (uint)uVar2;
        puVar10 = puVar9 + (ulong)uVar2 * 2 + 1;
        puVar9 = puVar9 + 1;
      }
      else {
        *puVar22 = (uint)*(ushort *)(buf + *(uint *)(pcVar20 + uVar4 * 4));
        puVar9 = (ushort *)(buf + (ulong)*(uint *)(pcVar20 + uVar4 * 4) + 2);
      }
    }
LAB_00108aef:
    *(ushort **)(puVar22 + 2) = puVar9;
    (prVar5->high_low_container).containers[uVar4] = puVar22;
    puVar22 = puVar22 + 4;
    uVar4 = uVar4 + 1;
    puVar9 = puVar10;
  } while( true );
}

Assistant:

ALLOW_UNALIGNED
roaring_bitmap_t *roaring_bitmap_portable_deserialize_frozen(const char *buf) {
    char *start_of_buf = (char *)buf;
    uint32_t cookie;
    int32_t num_containers;
    uint16_t *descriptive_headers;
    uint32_t *offset_headers = NULL;
    const char *run_flag_bitset = NULL;
    bool hasrun = false;

    // deserialize cookie
    memcpy(&cookie, buf, sizeof(uint32_t));
    buf += sizeof(uint32_t);
    if (cookie == SERIAL_COOKIE_NO_RUNCONTAINER) {
        memcpy(&num_containers, buf, sizeof(int32_t));
        buf += sizeof(int32_t);
        descriptive_headers = (uint16_t *)buf;
        buf += num_containers * 2 * sizeof(uint16_t);
        offset_headers = (uint32_t *)buf;
        buf += num_containers * sizeof(uint32_t);
    } else if ((cookie & 0xFFFF) == SERIAL_COOKIE) {
        num_containers = (cookie >> 16) + 1;
        hasrun = true;
        int32_t run_flag_bitset_size = (num_containers + 7) / 8;
        run_flag_bitset = buf;
        buf += run_flag_bitset_size;
        descriptive_headers = (uint16_t *)buf;
        buf += num_containers * 2 * sizeof(uint16_t);
        if (num_containers >= NO_OFFSET_THRESHOLD) {
            offset_headers = (uint32_t *)buf;
            buf += num_containers * sizeof(uint32_t);
        }
    } else {
        return NULL;
    }

    // calculate total size for allocation
    int32_t num_bitset_containers = 0;
    int32_t num_run_containers = 0;
    int32_t num_array_containers = 0;

    for (int32_t i = 0; i < num_containers; i++) {
        uint16_t tmp;
        memcpy(&tmp, descriptive_headers + 2 * i + 1, sizeof(tmp));
        uint32_t cardinality = tmp + 1;
        bool isbitmap = (cardinality > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((run_flag_bitset[i / 8] & (1 << (i % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }

        if (isbitmap) {
            num_bitset_containers++;
        } else if (isrun) {
            num_run_containers++;
        } else {
            num_array_containers++;
        }
    }

    size_t alloc_size = 0;
    alloc_size += sizeof(roaring_bitmap_t);
    alloc_size += num_containers * sizeof(container_t *);
    alloc_size += num_bitset_containers * sizeof(bitset_container_t);
    alloc_size += num_run_containers * sizeof(run_container_t);
    alloc_size += num_array_containers * sizeof(array_container_t);
    alloc_size += num_containers * sizeof(uint16_t);  // keys
    alloc_size += num_containers * sizeof(uint8_t);   // typecodes

    // allocate bitmap and construct containers
    char *arena = (char *)roaring_malloc(alloc_size);
    if (arena == NULL) {
        return NULL;
    }

    roaring_bitmap_t *rb =
        (roaring_bitmap_t *)arena_alloc(&arena, sizeof(roaring_bitmap_t));
    rb->high_low_container.flags = ROARING_FLAG_FROZEN;
    rb->high_low_container.allocation_size = num_containers;
    rb->high_low_container.size = num_containers;
    rb->high_low_container.containers = (container_t **)arena_alloc(
        &arena, sizeof(container_t *) * num_containers);

    uint16_t *keys =
        (uint16_t *)arena_alloc(&arena, num_containers * sizeof(uint16_t));
    uint8_t *typecodes =
        (uint8_t *)arena_alloc(&arena, num_containers * sizeof(uint8_t));

    rb->high_low_container.keys = keys;
    rb->high_low_container.typecodes = typecodes;

    for (int32_t i = 0; i < num_containers; i++) {
        uint16_t tmp;
        memcpy(&tmp, descriptive_headers + 2 * i + 1, sizeof(tmp));
        int32_t cardinality = tmp + 1;
        bool isbitmap = (cardinality > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((run_flag_bitset[i / 8] & (1 << (i % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }

        keys[i] = descriptive_headers[2 * i];

        if (isbitmap) {
            typecodes[i] = BITSET_CONTAINER_TYPE;
            bitset_container_t *c = (bitset_container_t *)arena_alloc(
                &arena, sizeof(bitset_container_t));
            c->cardinality = cardinality;
            if (offset_headers != NULL) {
                c->words = (uint64_t *)(start_of_buf + offset_headers[i]);
            } else {
                c->words = (uint64_t *)buf;
                buf += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            }
            rb->high_low_container.containers[i] = c;
        } else if (isrun) {
            typecodes[i] = RUN_CONTAINER_TYPE;
            run_container_t *c =
                (run_container_t *)arena_alloc(&arena, sizeof(run_container_t));
            c->capacity = cardinality;
            uint16_t n_runs;
            if (offset_headers != NULL) {
                memcpy(&n_runs, start_of_buf + offset_headers[i],
                       sizeof(uint16_t));
                c->n_runs = n_runs;
                c->runs = (rle16_t *)(start_of_buf + offset_headers[i] +
                                      sizeof(uint16_t));
            } else {
                memcpy(&n_runs, buf, sizeof(uint16_t));
                c->n_runs = n_runs;
                buf += sizeof(uint16_t);
                c->runs = (rle16_t *)buf;
                buf += c->n_runs * sizeof(rle16_t);
            }
            rb->high_low_container.containers[i] = c;
        } else {
            typecodes[i] = ARRAY_CONTAINER_TYPE;
            array_container_t *c = (array_container_t *)arena_alloc(
                &arena, sizeof(array_container_t));
            c->cardinality = cardinality;
            c->capacity = cardinality;
            if (offset_headers != NULL) {
                c->array = (uint16_t *)(start_of_buf + offset_headers[i]);
            } else {
                c->array = (uint16_t *)buf;
                buf += cardinality * sizeof(uint16_t);
            }
            rb->high_low_container.containers[i] = c;
        }
    }

    return rb;
}